

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O1

wchar_t * ConvertToCLangFormat(wchar_t *format,ON_wStringBuffer *clang_format_buffer)

{
  wchar_t wVar1;
  bool bVar2;
  long lVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  wchar_t *pwVar6;
  
  lVar3 = 0;
  pwVar4 = format;
  do {
    pwVar5 = pwVar4;
    if (*pwVar4 == L'%') {
      if (pwVar4[1] == L's') {
        lVar3 = lVar3 + 1;
        pwVar5 = pwVar4 + 2;
      }
      else if ((uint)(pwVar4[1] + L'\xffffffcf') < 9) {
        pwVar4 = pwVar4 + 3;
        do {
          pwVar6 = pwVar4;
          pwVar4 = pwVar6 + 1;
        } while ((uint)(pwVar6[-1] + L'\xffffffd0') < 10);
        pwVar5 = pwVar6 + -1;
        if ((pwVar6[-1] == L'$') && (*pwVar6 == L's')) {
          lVar3 = lVar3 + 1;
          pwVar5 = pwVar6 + 1;
        }
      }
      else {
        pwVar5 = pwVar4 + 1;
      }
    }
    pwVar4 = pwVar5 + 1;
  } while (*pwVar5 != L'\0');
  pwVar5 = format;
  if (((lVar3 != 0) &&
      (bVar2 = ON_wStringBuffer::GrowBuffer
                         (clang_format_buffer,lVar3 + ((long)pwVar4 - (long)format >> 2) + 1), bVar2
      )) && (pwVar4 = clang_format_buffer->m_buffer, pwVar6 = pwVar4, pwVar4 != (wchar_t *)0x0)) {
    do {
      if (*format == L'%') {
        *pwVar6 = L'%';
        wVar1 = format[1];
        if (wVar1 == L's') {
LAB_005c8afd:
          pwVar6[1] = L'l';
          pwVar5 = format + 1;
          format = format + 2;
          pwVar6[2] = *pwVar5;
          pwVar6 = pwVar6 + 3;
        }
        else if ((uint)(wVar1 + L'\xffffffcf') < 9) {
          pwVar6[1] = wVar1;
          pwVar6 = pwVar6 + 2;
          pwVar5 = format + 2;
          format = format + 2;
          wVar1 = *pwVar5;
          while ((uint)(wVar1 + L'\xffffffd0') < 10) {
            *pwVar6 = wVar1;
            pwVar6 = pwVar6 + 1;
            pwVar5 = format + 1;
            format = format + 1;
            wVar1 = *pwVar5;
          }
          if ((wVar1 == L'$') && (format[1] == L's')) {
            *pwVar6 = L'$';
            goto LAB_005c8afd;
          }
        }
        else {
          format = format + 1;
          pwVar6 = pwVar6 + 1;
        }
      }
      wVar1 = *format;
      format = format + 1;
      *pwVar6 = wVar1;
      pwVar6 = pwVar6 + 1;
      pwVar5 = pwVar4;
    } while (wVar1 != L'\0');
  }
  return pwVar5;
}

Assistant:

static const wchar_t* ConvertToCLangFormat(
  const wchar_t* format,
  ON_wStringBuffer& clang_format_buffer
  )
{
  size_t format_capacity = 0;
  const wchar_t* s;
  wchar_t c;

  s = format;
  for(;;)
  {
    if ('%' == *s)
    {
      s++;
      c = *s;
      if ('s' == c )
      {
        // convert %s to %ls
        format_capacity++;
        s++;
      }
      else if (c >= '1' && c <= '9')
      {
        // look for %N$s  with N >= 1 ...
        s++;
        while (*s >= '0' && *s <= '9')
          s++;
        if ('$' == *s && 's' == s[1] )
        {
          // convert %N$s to %N$ls
          format_capacity++;
          s++;
          s++;
        }
      }
    }
    if ( 0 == *s++ )
      break;
  }

  if (0 == format_capacity)
    return format;

  format_capacity += (s - format) + 1; // +1 for null terminator

  if ( !clang_format_buffer.GrowBuffer(format_capacity) )
    return format;

  wchar_t* ls = clang_format_buffer.m_buffer; 
  if ( nullptr == ls )
    return format;

  s = format;
  format = ls;
  for(;;)
  {
    if ('%' == *s)
    {
      *ls++ = *s++;
      c = *s;
      if ('s' == c )
      {
        // convert %s to %ls
        *ls++ = 'l';
        *ls++ = *s++;
      }
      else if (c >= '1' && c <= '9')
      {
        // look for %N$s  with N >= 1 ...
        *ls++ = *s++;
        while (*s >= '0' && *s <= '9')
          *ls++ = *s++;
        if ('$' == *s && 's' == s[1] )
        {
          // convert %N$s to %N$ls
          *ls++ = *s++;
          *ls++ = 'l';
          *ls++ = *s++;
        }
      }

    }
    if ( 0 == (*ls++ = *s++) )
      break;
  }

  return format;
}